

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall
IF97::Region3Backwards::Region3RegionDivision::T_p(Region3RegionDivision *this,double p)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  double pi;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (this->N == 0) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    sVar4 = 0;
    do {
      uVar1 = (this->I).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[sVar4];
      dVar6 = 1.0;
      if (uVar1 != 0) {
        uVar3 = -uVar1;
        if (0 < (int)uVar1) {
          uVar3 = uVar1;
        }
        dVar7 = 1.0 / p;
        if (-1 < (int)uVar1) {
          dVar7 = p;
        }
        dVar6 = 1.0;
        do {
          if ((uVar3 & 1) != 0) {
            dVar6 = dVar6 * dVar7;
          }
          dVar7 = dVar7 * dVar7;
          bVar2 = 1 < uVar3;
          uVar3 = uVar3 >> 1;
        } while (bVar2);
      }
      dVar5 = dVar5 + dVar6 * (this->n).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar4 != this->N);
  }
  return dVar5;
}

Assistant:

virtual double T_p(double p){
                const double pi = p/(1.0*p_fact);
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*powi(pi, I[i]);
                }
                return summer*1.0;  // sum is multiplied by T* = 1.0 [K]
            }